

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::CreateFunctionWithLengthAndPrototypeType
          (JavascriptLibrary *this,DynamicObject *prototype,FunctionInfo *functionInfo)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext **ppSVar5;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  DynamicType *pDVar6;
  JavascriptMethod local_40;
  FunctionInfo *functionInfo_local;
  DynamicObject *prototype_local;
  JavascriptLibrary *this_local;
  
  BVar3 = FunctionInfo::HasBody(functionInfo);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x51d,"(!functionInfo->HasBody())","!functionInfo->HasBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar5;
  if ((this->inProfileMode & 1U) == 0) {
    local_40 = FunctionInfo::GetOriginalEntryPoint(functionInfo);
  }
  else {
    local_40 = ScriptContext::DebugProfileProbeThunk;
  }
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(*ppSVar5,(SimplePropertyDescriptor *)
                             FunctionWithLengthAndPrototypeTypeDescriptors,2,0,0,false,false);
  pDVar6 = DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                            local_40,&typeHandler->super_DynamicTypeHandler,false,false);
  return pDVar6;
}

Assistant:

DynamicType * JavascriptLibrary::CreateFunctionWithLengthAndPrototypeType(DynamicObject * prototype, FunctionInfo * functionInfo)
    {
        Assert(!functionInfo->HasBody());
        return DynamicType::New(scriptContext, TypeIds_Function, prototype,
            this->inProfileMode? ProfileEntryThunk : functionInfo->GetOriginalEntryPoint(),
            SimpleDictionaryTypeHandler::New(scriptContext, FunctionWithLengthAndPrototypeTypeDescriptors, _countof(FunctionWithLengthAndPrototypeTypeDescriptors), 0, 0));
    }